

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsQuerySetTarget(HelicsQuery query,char *target,HelicsError *err)

{
  QueryObject *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  QueryObject *queryObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  HelicsQuery in_stack_ffffffffffffffa8;
  bool local_42;
  allocator<char> local_41 [17];
  undefined8 in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  this = anon_unknown.dwarf_1a6d0::getQueryObj
                   (in_stack_ffffffffffffffa8,(HelicsError *)in_stack_ffffffffffffffa0);
  if (this != (QueryObject *)0x0) {
    local_42 = in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_42) {
      std::__cxx11::string::string(&this->target,in_stack_ffffffffffffffd8);
    }
    else {
      in_stack_ffffffffffffffa0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&this->target,(char *)in_stack_ffffffffffffffd8,
                 (allocator<char> *)in_stack_ffffffffffffffd0);
      in_stack_ffffffffffffff98 = in_RSI;
    }
    local_42 = !local_42;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::__cxx11::string::~string(in_stack_ffffffffffffffa0);
    if (local_42) {
      std::allocator<char>::~allocator(local_41);
    }
  }
  return;
}

Assistant:

void helicsQuerySetTarget(HelicsQuery query, const char* target, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return;
    }
    queryObj->target = AS_STRING(target);
}